

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite_Internals.cpp
# Opt level: O3

bool __thiscall
psy::C::InternalsTestSuite::checkErrorAndWarn(InternalsTestSuite *this,Expectation *X)

{
  pointer pbVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  string *id;
  undefined8 uVar5;
  const_iterator cVar6;
  long *plVar7;
  ostream *poVar8;
  int iVar9;
  char *pcVar10;
  int iVar11;
  pointer pbVar12;
  Diagnostic *diagnostic;
  pointer pDVar13;
  string msg;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  W_IDs;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  E_IDs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [24];
  long lStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  long *local_90;
  undefined8 uStack_88;
  undefined4 local_80;
  undefined8 local_78;
  _Alloc_hider _Stack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  long *local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_40;
  __node_base_ptr p_Stack_38;
  
  local_68._M_allocated_capacity = (size_type)&p_Stack_38;
  local_68._8_8_ = 1;
  local_58 = (long *)0x0;
  uStack_50 = 0;
  local_48 = 0x3f800000;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_a0._M_allocated_capacity = (size_type)&_Stack_70;
  local_a0._8_8_ = 1;
  local_90 = (long *)0x0;
  uStack_88 = 0;
  local_80 = 0x3f800000;
  local_78 = 0;
  _Stack_70._M_p = (pointer)0x0;
  SyntaxTree::diagnostics
            ((vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_> *)local_c0,
             (this->tree_)._M_t.
             super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>.
             super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  if (local_c0._0_8_ == local_c0._8_8_) {
    iVar11 = 0;
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    iVar11 = 0;
    pDVar13 = (pointer)local_c0._0_8_;
    do {
      if (X->containsAmbiguity_ == true) {
        id = (string *)psy::DiagnosticDescriptor::id_abi_cxx11_();
        bVar2 = isDiagnosticDescriptorIdOfSyntaxAmbiguity(id);
        if (!bVar2) goto LAB_003ed938;
      }
      else {
LAB_003ed938:
        cVar3 = psy::Diagnostic::severity();
        if (cVar3 == '\x02') {
          uVar5 = psy::DiagnosticDescriptor::id_abi_cxx11_();
          local_e0._M_dataplus._M_p = (pointer)&local_68;
          std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&local_68,uVar5,&local_e0);
          iVar9 = iVar9 + 1;
        }
        else {
          cVar3 = psy::Diagnostic::severity();
          if (cVar3 == '\x01') {
            uVar5 = psy::DiagnosticDescriptor::id_abi_cxx11_();
            local_e0._M_dataplus._M_p = (pointer)&local_a0;
            std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_e0._M_dataplus._M_p,uVar5,&local_e0);
            iVar11 = iVar11 + 1;
          }
        }
      }
      pDVar13 = pDVar13 + 1;
    } while (pDVar13 != (pointer)local_c0._8_8_);
  }
  std::vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_>::~vector
            ((vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_> *)local_c0);
  if ((X->numW_ != iVar11) || (iVar4 = iVar11, X->numE_ != iVar9)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mismatch in ",0xc);
    bVar2 = X->numW_ != iVar11;
    pcVar10 = "WARNING";
    if (!bVar2) {
      pcVar10 = "ERROR";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar10,(ulong)bVar2 * 2 + 5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," count",6);
    iVar4 = X->numW_;
  }
  if (iVar11 == iVar4) {
    if (iVar9 == X->numE_) {
      pbVar12 = (X->descriptorsW_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (X->descriptorsW_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar12 != pbVar1) {
        do {
          cVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)&local_a0,pbVar12);
          if (cVar6.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::operator+(&local_e0,"WARNING ",pbVar12);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
            local_c0._0_8_ = *plVar7;
            pDVar13 = (pointer)(plVar7 + 2);
            if ((pointer)local_c0._0_8_ == pDVar13) {
              local_c0._16_8_ = (pDVar13->descriptor_).id_._M_dataplus._M_p;
              lStack_a8 = plVar7[3];
              local_c0._0_8_ = (pointer)(local_c0 + 0x10);
            }
            else {
              local_c0._16_8_ = (pDVar13->descriptor_).id_._M_dataplus._M_p;
            }
            local_c0._8_8_ = plVar7[1];
            *plVar7 = (long)pDVar13;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if (local_90 != (long *)0x0) {
              plVar7 = local_90;
              do {
                std::operator+(&local_e0,"\n\t\t- ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (plVar7 + 1));
                std::__cxx11::string::_M_append(local_c0,(ulong)local_e0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
                plVar7 = (long *)*plVar7;
              } while (plVar7 != (long *)0x0);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\n!\tFAIL\n",8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tReason: ",9)
            ;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_c0._0_8_,local_c0._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                       ,99);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xa6);
            std::endl<char,std::char_traits<char>>(poVar8);
            uVar5 = __cxa_allocate_exception(1);
            __cxa_throw(uVar5,&TestFailed::typeinfo,0);
          }
          pbVar12 = pbVar12 + 1;
        } while (pbVar12 != pbVar1);
      }
      pbVar12 = (X->descriptorsE_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (X->descriptorsE_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar12 != pbVar1) {
        do {
          cVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)&local_68,pbVar12);
          if (cVar6.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::operator+(&local_e0,"ERROR ",pbVar12);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
            local_c0._0_8_ = *plVar7;
            pDVar13 = (pointer)(plVar7 + 2);
            if ((pointer)local_c0._0_8_ == pDVar13) {
              local_c0._16_8_ = (pDVar13->descriptor_).id_._M_dataplus._M_p;
              lStack_a8 = plVar7[3];
              local_c0._0_8_ = (pointer)(local_c0 + 0x10);
            }
            else {
              local_c0._16_8_ = (pDVar13->descriptor_).id_._M_dataplus._M_p;
            }
            local_c0._8_8_ = plVar7[1];
            *plVar7 = (long)pDVar13;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if (local_58 != (long *)0x0) {
              plVar7 = local_58;
              do {
                std::operator+(&local_e0,"\n\t\t- ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (plVar7 + 1));
                std::__cxx11::string::_M_append(local_c0,(ulong)local_e0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
                plVar7 = (long *)*plVar7;
              } while (plVar7 != (long *)0x0);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\n!\tFAIL\n",8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tReason: ",9)
            ;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_c0._0_8_,local_c0._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                       ,99);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xaf);
            std::endl<char,std::char_traits<char>>(poVar8);
            uVar5 = __cxa_allocate_exception(1);
            __cxa_throw(uVar5,&TestFailed::typeinfo,0);
          }
          pbVar12 = pbVar12 + 1;
        } while (pbVar12 != pbVar1);
      }
      if ((X->numE_ == 0) || (X->continueTestDespiteOfErrors_ == true)) {
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&local_a0);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&local_68);
      return bVar2;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tExpected: ",0xc);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,X->numE_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
               ,99);
    iVar9 = 0x9f;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tExpected: ",0xc);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,X->numW_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
               ,99);
    iVar9 = 0x9e;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
  }
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar9);
  std::endl<char,std::char_traits<char>>(poVar8);
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&TestFailed::typeinfo,0);
}

Assistant:

bool InternalsTestSuite::checkErrorAndWarn(Expectation X)
{
    int E_cnt = 0;
    int W_cnt = 0;
    std::unordered_set<std::string> E_IDs;
    std::unordered_set<std::string> W_IDs;
    for (const auto& diagnostic : tree_->diagnostics()) {
        if (X.containsAmbiguity_
                && isDiagnosticDescriptorIdOfSyntaxAmbiguity(diagnostic.descriptor().id()))
            continue;

        if (diagnostic.severity() == DiagnosticSeverity::Error) {
            ++E_cnt;
            E_IDs.insert(diagnostic.descriptor().id());
        }
        else if (diagnostic.severity() == DiagnosticSeverity::Warning) {
            ++W_cnt;
            W_IDs.insert(diagnostic.descriptor().id());
        }
    }

#ifdef DBG_DIAGNOSTICS
    if (!tree_->diagnostics().empty()) {
        for (auto& diagnostic : tree_->diagnostics()) {
            diagnostic.outputIndent_ = 2;
            std::cout << std::endl << diagnostic << std::endl;
        }
        std::cout << "\t";
    }
#endif

    if (X.numW_ != W_cnt || X.numE_ != E_cnt) {
#ifdef DBG_DIAGNOSTICS
        std::cout << "\n\t" << std::string(25, '%') << "\n\t";
#endif
        std::cout << "mismatch in ";
        if (X.numW_ != W_cnt)
            std::cout << "WARNING";
        else
            std::cout << "ERROR";
        std::cout << " count";

#ifdef DBG_DIAGNOSTICS
        std::cout << "\n\t" << std::string(25, '%');
#endif
    }

    PSY_EXPECT_EQ_INT(W_cnt, X.numW_);
    PSY_EXPECT_EQ_INT(E_cnt, X.numE_);

    for (const auto& id : X.descriptorsW_) {
        if (!W_IDs.count(id)) {
            std::string msg = "WARNING " + id + " not found, got:";
            for (const auto& idP : W_IDs)
                msg += "\n\t\t- " + idP;
            PSY__internals__FAIL(msg);
        }
    }

    for (const auto& id : X.descriptorsE_) {
        if (!E_IDs.count(id)) {
            std::string msg = "ERROR " + id + " not found, got:";
            for (const auto& idP : E_IDs)
                msg += "\n\t\t- " + idP;
            PSY__internals__FAIL(msg);
        }
    }

    if (X.numE_ && !X.continueTestDespiteOfErrors_)
        return false;

    return true;
}